

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Show.hpp
# Opt level: O2

void rc::showCollection<std::array<unsigned_long,4ul>>
               (string *prefix,string *suffix,array<unsigned_long,_4UL> *collection,ostream *os)

{
  long lVar1;
  
  std::operator<<(os,(string *)prefix);
  lVar1 = 0;
  while( true ) {
    detail::ShowDefault<unsigned_long,_false,_true>::show
              ((unsigned_long *)((long)collection->_M_elems + lVar1),os);
    if (lVar1 == 0x18) break;
    std::operator<<(os,", ");
    lVar1 = lVar1 + 8;
  }
  std::operator<<(os,(string *)suffix);
  return;
}

Assistant:

void showCollection(const std::string &prefix,
                    const std::string &suffix,
                    const Collection &collection,
                    std::ostream &os) {
  os << prefix;
  auto cbegin = begin(collection);
  auto cend = end(collection);
  if (cbegin != cend) {
    show(*cbegin, os);
    for (auto it = ++cbegin; it != cend; it++) {
      os << ", ";
      show(*it, os);
    }
  }
  os << suffix;
}